

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

bool __thiscall
imrt::EvaluationFunction::Zupdate
          (EvaluationFunction *this,int angle,int b,double delta_intensity,bool return_if_unfeasible
          ,vector<double,_std::allocator<double>_> *Zmax)

{
  double dVar1;
  bool bVar2;
  reference ppVar3;
  Matrix *this_00;
  reference pvVar4;
  reference pvVar5;
  byte in_CL;
  int in_EDX;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  pair<std::pair<int,_int>,_double> pVar6;
  double delta;
  Matrix *Dep;
  int k;
  int o;
  pair<const_double,_std::pair<int,_int>_> voxel;
  iterator __end1;
  iterator __begin1;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__range1;
  bool feasible;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  Volume *in_stack_fffffffffffffed0;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *this_01;
  int iStack_90;
  int iStack_8c;
  _Self local_88;
  _Self local_80;
  undefined1 *local_78;
  byte local_69;
  pair<int,_int> local_68;
  undefined1 local_60 [48];
  vector<double,_std::allocator<double>_> *local_30;
  byte local_21;
  double local_20;
  int local_18;
  byte local_1;
  
  local_20 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_21 = in_CL & 1;
  local_30 = in_R8;
  local_18 = in_EDX;
  local_68 = std::make_pair<int&,int&>
                       ((int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (int *)0x12f196);
  std::
  unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
  ::at((unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
        *)in_stack_fffffffffffffed0,
       (key_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffed0,
             (multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_69 = 1;
  local_78 = local_60;
  local_80._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::begin((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_88._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::end((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  do {
    bVar2 = std::operator!=(&local_80,&local_88);
    if (!bVar2) {
      local_1 = local_69 & 1;
LAB_0012f478:
      std::
      multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
      ::~multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                   *)0x12f485);
      return (bool)(local_1 & 1);
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
                        0x12f22d);
    iStack_90 = (ppVar3->second).first;
    iStack_8c = (ppVar3->second).second;
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
              (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
               (long)iStack_90);
    this_00 = Volume::getDepositionMatrix(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    dVar1 = maths::Matrix::operator()(this_00,iStack_8c,local_18);
    this_01 = (list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
               *)(dVar1 * local_20);
    if (((double)this_01 != 0.0) || (NAN((double)this_01))) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)iStack_90);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iStack_8c);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_90);
      if ((*pvVar5 <= dVar1 + (double)this_01 && dVar1 + (double)this_01 != *pvVar5) &&
         (local_69 = 0, (local_21 & 1) != 0)) {
        local_1 = 0;
        goto LAB_0012f478;
      }
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)iStack_90);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iStack_8c);
      *pvVar5 = *pvVar5 + (double)this_01;
      std::make_pair<int&,int&>
                ((int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (int *)0x12f3f8);
      pVar6 = std::make_pair<std::pair<int,int>,double&>
                        ((pair<int,_int> *)in_stack_fffffffffffffed0,
                         (double *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffed0 = (Volume *)pVar6.second;
      std::__cxx11::
      list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
      ::push_back(this_01,(value_type *)pVar6.first);
    }
    std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffed0);
  } while( true );
}

Assistant:

bool EvaluationFunction::Zupdate(int angle, int b, double delta_intensity, bool return_if_unfeasible,
			vector<double>& Zmax){

	multimap<double, pair<int,int> > voxels = beamlet2voxel_list.at(make_pair(angle,b));
	bool feasible = true;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 double delta = Dep(k,b)*(delta_intensity);
		 if(delta==0.0) continue;

		 if(Z[o][k] + delta > Zmax[o]){
			 feasible=false;
			 if(return_if_unfeasible) return feasible;
		 }

		 Z[o][k] += delta;
		 Z_diff.push_back(make_pair(make_pair(o,k),delta));
	 }

	 return feasible;
}